

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t>::LoadNextGroup
          (BitpackingScanState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  uhugeint_t *this_00;
  BitpackingMode BVar1;
  uint *puVar2;
  uint64_t uVar3;
  uint8_t uVar4;
  uint64_t *puVar5;
  InternalException *this_01;
  bitpacking_metadata_t group;
  allocator local_39;
  string local_38;
  
  this->current_group_offset = 0;
  puVar2 = (uint *)this->bitpacking_metadata_ptr;
  group = (bitpacking_metadata_t)
          ((ulong)(*puVar2 & 0xffffff) << 0x20 | (ulong)*(byte *)((long)puVar2 + 3));
  this->current_group = group;
  this->bitpacking_metadata_ptr = (data_ptr_t)(puVar2 + -1);
  puVar5 = (uint64_t *)GetPtr(this,group);
  this->current_group_ptr = (data_ptr_t)puVar5;
  BVar1 = (this->current_group).mode;
  if (BVar1 - 3 < 3) {
    uVar3 = puVar5[1];
    (this->current_frame_of_reference).lower = *puVar5;
    (this->current_frame_of_reference).upper = uVar3;
    this_00 = (uhugeint_t *)(puVar5 + 2);
    this->current_group_ptr = (data_ptr_t)this_00;
    if (BVar1 == CONSTANT_DELTA) {
      uVar3 = puVar5[3];
      (this->current_constant).lower = this_00->lower;
      (this->current_constant).upper = uVar3;
    }
    else {
      uVar4 = uhugeint_t::operator_cast_to_unsigned_char(this_00);
      this->current_width = uVar4;
      puVar5 = (uint64_t *)this->current_group_ptr;
      this->current_group_ptr = (data_ptr_t)(puVar5 + 2);
      if ((this->current_group).mode != DELTA_FOR) {
        return;
      }
      uVar3 = puVar5[3];
      (this->current_delta_offset).lower = puVar5[2];
      (this->current_delta_offset).upper = uVar3;
    }
    puVar5 = puVar5 + 4;
  }
  else {
    if (BVar1 != CONSTANT) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string((string *)&local_38,"Invalid bitpacking mode",&local_39);
      InternalException::InternalException(this_01,&local_38);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar3 = puVar5[1];
    (this->current_constant).lower = *puVar5;
    (this->current_constant).upper = uVar3;
    puVar5 = puVar5 + 2;
  }
  this->current_group_ptr = (data_ptr_t)puVar5;
  return;
}

Assistant:

void LoadNextGroup() {
		D_ASSERT(bitpacking_metadata_ptr > handle.Ptr() &&
		         (bitpacking_metadata_ptr < handle.Ptr() + current_segment.GetBlockManager().GetBlockSize()));
		current_group_offset = 0;
		current_group = DecodeMeta(reinterpret_cast<bitpacking_metadata_encoded_t *>(bitpacking_metadata_ptr));

		bitpacking_metadata_ptr -= sizeof(bitpacking_metadata_encoded_t);
		current_group_ptr = GetPtr(current_group);

		// Read first value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::CONSTANT_DELTA:
		case BitpackingMode::DELTA_FOR:
			current_frame_of_reference = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read second value
		switch (current_group.mode) {
		case BitpackingMode::CONSTANT_DELTA:
			current_constant = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
			break;
		case BitpackingMode::FOR:
		case BitpackingMode::DELTA_FOR:
			current_width = (bitpacking_width_t)(*reinterpret_cast<T *>(current_group_ptr));
			current_group_ptr += MaxValue(sizeof(T), sizeof(bitpacking_width_t));
			break;
		case BitpackingMode::CONSTANT:
			break;
		default:
			throw InternalException("Invalid bitpacking mode");
		}

		// Read third value
		if (current_group.mode == BitpackingMode::DELTA_FOR) {
			current_delta_offset = *reinterpret_cast<T *>(current_group_ptr);
			current_group_ptr += sizeof(T);
		}
	}